

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_21360af::EncodeTxbInitLevelTest::RunTest
          (EncodeTxbInitLevelTest *this,av1_txb_init_levels_func test_func,int tx_size,int is_speed)

{
  EncodeTxbInitLevelTest *pEVar1;
  undefined8 *puVar2;
  uint32_t uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uchar *lhs;
  uint uVar8;
  int iVar9;
  SEARCH_METHODS *message;
  int i;
  long lVar10;
  int width;
  ACMRandom rnd;
  AssertionResult gtest_ar;
  aom_usec_timer timer;
  uint8_t levels_buf [2] [1312];
  tran_low_t coeff [4096];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4b00;
  int local_4af4;
  double local_4af0;
  EncodeTxbInitLevelTest *local_4ae8;
  Random local_4adc;
  ulong local_4ad8;
  long local_4ad0;
  AssertHelper local_4ac8;
  ulong local_4ac0;
  ulong local_4ab8;
  internal local_4ab0 [8];
  undefined8 *local_4aa8;
  long local_4aa0;
  timeval local_4a98;
  timeval local_4a88;
  uint8_t local_4a78 [1312];
  undefined1 local_4558 [1312];
  tran_low_t local_4038 [4098];
  
  uVar8 = (uint)test_func & 0xff;
  if (uVar8 < 0x11) {
    uVar5 = 3;
    if ((1 < uVar8 - 0xb) && (uVar8 != 4)) {
LAB_00748552:
      uVar5 = (ulong)test_func & 0xff;
    }
  }
  else if (uVar8 == 0x11) {
    uVar5 = 9;
  }
  else {
    if (uVar8 != 0x12) goto LAB_00748552;
    uVar5 = 10;
  }
  local_4ac0 = (ulong)(uint)::tx_size_wide[uVar5];
  if (uVar8 < 0x11) {
    uVar6 = 3;
    if ((uVar8 - 0xb < 2) || (uVar8 == 4)) goto LAB_00748595;
  }
  else {
    if (uVar8 == 0x11) {
      uVar6 = 9;
      goto LAB_00748595;
    }
    if (uVar8 == 0x12) {
      uVar6 = 10;
      goto LAB_00748595;
    }
  }
  uVar6 = (ulong)test_func & 0xff;
LAB_00748595:
  local_4ab8 = (ulong)(uint)::tx_size_high[uVar6];
  local_4adc.state_ = 0xbaba;
  uVar8 = ::tx_size_high[uVar6] * ::tx_size_wide[uVar5];
  local_4ae8 = this;
  if (0 < (int)uVar8) {
    uVar5 = 0;
    do {
      uVar3 = testing::internal::Random::Generate(&local_4adc,0x80000000);
      local_4038[uVar5] = (int)(short)(uVar3 >> 0xf);
      uVar5 = uVar5 + 1;
    } while (uVar8 != uVar5);
  }
  lVar10 = 0;
  do {
    uVar3 = testing::internal::Random::Generate(&local_4adc,0x80000000);
    local_4a78[lVar10] = (uint8_t)(uVar3 >> 0x17);
    uVar3 = testing::internal::Random::Generate(&local_4adc,0x80000000);
    local_4558[lVar10] = (char)(uVar3 >> 0x17);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x520);
  local_4af0 = (double)CONCAT44(local_4af0._4_4_,tx_size);
  iVar9 = 1;
  if (tx_size != 0) {
    iVar9 = uVar8 * 10000;
  }
  gettimeofday(&local_4a98,(__timezone_ptr_t)0x0);
  uVar6 = local_4ab8;
  uVar5 = local_4ac0;
  iVar4 = (int)local_4ab8;
  width = (int)local_4ac0;
  local_4af4 = iVar9;
  if (0 < iVar9) {
    do {
      av1_txb_init_levels_c(local_4038,width,iVar4,local_4a78);
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  gettimeofday(&local_4a88,(__timezone_ptr_t)0x0);
  local_4ad0 = local_4a88.tv_sec - local_4a98.tv_sec;
  local_4ad8 = local_4a88.tv_usec - local_4a98.tv_usec;
  local_4aa0 = local_4ad8 + 1000000;
  if (-1 < (long)local_4ad8) {
    local_4aa0 = local_4ad8;
  }
  gettimeofday(&local_4a98,(__timezone_ptr_t)0x0);
  pEVar1 = local_4ae8;
  if (0 < local_4af4) {
    iVar9 = local_4af4;
    do {
      (*(code *)pEVar1)(local_4038,uVar5 & 0xffffffff,uVar6 & 0xffffffff,local_4558);
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  gettimeofday(&local_4a88,(__timezone_ptr_t)0x0);
  if (local_4af0._0_4_ != 0) {
    local_4af0 = (double)((local_4ad0 + ((long)local_4ad8 >> 0x3f)) * 1000000 + local_4aa0);
    lVar7 = local_4a88.tv_usec - local_4a98.tv_usec;
    lVar10 = lVar7 + 1000000;
    if (-1 < lVar7) {
      lVar10 = lVar7;
    }
    local_4ae8 = (EncodeTxbInitLevelTest *)
                 (double)(lVar10 + ((lVar7 >> 0x3f) + (local_4a88.tv_sec - local_4a98.tv_sec)) *
                                   1000000);
    printf("init %3dx%-3d:%7.2f/%7.2fns",uVar5 & 0xffffffff,uVar6 & 0xffffffff);
    printf("(%3.2f)\n",local_4af0 / (double)local_4ae8);
  }
  uVar8 = width + 4;
  uVar5 = 1;
  if (1 < (int)uVar8) {
    uVar5 = (ulong)uVar8;
  }
  local_4ad0 = (long)(int)uVar8;
  iVar4 = iVar4 + 3;
  local_4af0 = 0.0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  local_4ad8 = (ulong)(iVar4 + 1);
  lhs = local_4a78;
  do {
    lVar10 = 0;
    local_4ae8 = (EncodeTxbInitLevelTest *)lhs;
    do {
      testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                (local_4ab0,"levels_buf[0][c + r * stride]","levels_buf[1][c + r * stride]",lhs,
                 lhs + 0x520);
      puVar2 = local_4aa8;
      if (local_4ab0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_4b00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4b00._M_head_impl + 0x10),"[",1);
        uVar5 = local_4ab8;
        std::ostream::operator<<(local_4b00._M_head_impl + 0x10,SUB84(local_4af0,0));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4b00._M_head_impl + 0x10),",",1);
        std::ostream::operator<<(local_4b00._M_head_impl + 0x10,-(int)lVar10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4b00._M_head_impl + 0x10),"] ",2);
        std::ostream::operator<<(local_4b00._M_head_impl + 0x10,local_4af4);
        std::ostream::operator<<(local_4b00._M_head_impl + 0x10,(int)local_4ac0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4b00._M_head_impl + 0x10),"x",1);
        std::ostream::operator<<(local_4b00._M_head_impl + 0x10,(int)uVar5);
        if (local_4aa8 == (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = (SEARCH_METHODS *)*local_4aa8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4ac8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encodetxb_test.cc"
                   ,0x100,(char *)message);
        testing::internal::AssertHelper::operator=(&local_4ac8,(Message *)&local_4b00);
        testing::internal::AssertHelper::~AssertHelper(&local_4ac8);
        if (local_4b00._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4b00._M_head_impl + 8))();
        }
        if (local_4aa8 == (undefined8 *)0x0) {
          return;
        }
        if ((undefined8 *)*local_4aa8 != local_4aa8 + 2) {
          operator_delete((undefined8 *)*local_4aa8);
        }
        operator_delete(local_4aa8);
        return;
      }
      if (local_4aa8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_4aa8 != local_4aa8 + 2) {
          operator_delete((undefined8 *)*local_4aa8);
        }
        operator_delete(puVar2);
      }
      lVar10 = lVar10 + -1;
      lhs = lhs + 1;
    } while (-lVar10 != uVar5);
    local_4af0 = (double)((long)local_4af0 + 1);
    lhs = (uchar *)((long)local_4ae8 + local_4ad0);
    if (local_4af0 == (double)local_4ad8) {
      return;
    }
  } while( true );
}

Assistant:

void EncodeTxbInitLevelTest::RunTest(av1_txb_init_levels_func test_func,
                                     int tx_size, int is_speed) {
  const int width = get_txb_wide((TX_SIZE)tx_size);
  const int height = get_txb_high((TX_SIZE)tx_size);
  tran_low_t coeff[MAX_TX_SQUARE];

  uint8_t levels_buf[2][TX_PAD_2D];
  uint8_t *const levels0 = set_levels(levels_buf[0], height);
  uint8_t *const levels1 = set_levels(levels_buf[1], height);

  ACMRandom rnd(ACMRandom::DeterministicSeed());
  for (int i = 0; i < width * height; i++) {
    coeff[i] = rnd.Rand16Signed();
  }
  for (int i = 0; i < TX_PAD_2D; i++) {
    levels_buf[0][i] = rnd.Rand8();
    levels_buf[1][i] = rnd.Rand8();
  }
  const int run_times = is_speed ? (width * height) * 10000 : 1;
  aom_usec_timer timer;
  aom_usec_timer_start(&timer);
  for (int i = 0; i < run_times; ++i) {
    av1_txb_init_levels_c(coeff, width, height, levels0);
  }
  const double t1 = get_time_mark(&timer);
  aom_usec_timer_start(&timer);
  for (int i = 0; i < run_times; ++i) {
    test_func(coeff, width, height, levels1);
  }
  const double t2 = get_time_mark(&timer);
  if (is_speed) {
    printf("init %3dx%-3d:%7.2f/%7.2fns", width, height, t1, t2);
    printf("(%3.2f)\n", t1 / t2);
  }
  const int stride = width + TX_PAD_HOR;
  for (int r = 0; r < height + TX_PAD_VER; ++r) {
    for (int c = 0; c < stride; ++c) {
      ASSERT_EQ(levels_buf[0][c + r * stride], levels_buf[1][c + r * stride])
          << "[" << r << "," << c << "] " << run_times << width << "x"
          << height;
    }
  }
}